

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NUMAMemoryPool.cpp
# Opt level: O1

void __thiscall xmrig::NUMAMemoryPool::~NUMAMemoryPool(NUMAMemoryPool *this)

{
  ~NUMAMemoryPool(this);
  operator_delete(this);
  return;
}

Assistant:

xmrig::NUMAMemoryPool::~NUMAMemoryPool()
{
    for (auto kv : m_map) {
        delete kv.second;
    }
}